

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O0

_Bool have_controlling_tty(void)

{
  int __fd;
  int *piVar1;
  _Bool local_9;
  int fd;
  
  __fd = open("/dev/tty",0);
  if (__fd < 0) {
    piVar1 = __errno_location();
    if (*piVar1 != 6) {
      perror("/dev/tty: open");
      exit(1);
    }
    local_9 = false;
  }
  else {
    close(__fd);
    local_9 = true;
  }
  return local_9;
}

Assistant:

bool have_controlling_tty(void)
{
    int fd = open("/dev/tty", O_RDONLY);
    if (fd < 0) {
        if (errno != ENXIO) {
            perror("/dev/tty: open");
            exit(1);
        }
        return false;
    } else {
        close(fd);
        return true;
    }
}